

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_constructor_test.h
# Opt level: O1

void phmap::priv::
     InitializerListBucketAllocTest<phmap::parallel_node_hash_set<std::__cxx11::string,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::__cxx11::string>,4ul,phmap::NullMutex>>
               (void)

{
  size_t sz;
  long lVar1;
  parallel_node_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL,_phmap::NullMutex>
  *s;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  gen;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  A alloc;
  parallel_node_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL,_phmap::NullMutex>
  m;
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_5b1;
  AssertHelper local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5a8;
  undefined1 local_5a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_598;
  _Head_base<3UL,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_580;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_578;
  allocator_type local_560;
  undefined4 local_558;
  pointer local_550;
  pointer pbStack_548;
  pointer local_540;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_498;
  
  hash_internal::
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator()(&local_538,&local_5b1);
  hash_internal::
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator()(&local_518,&local_5b1);
  hash_internal::
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator()(&local_4f8,&local_5b1);
  hash_internal::
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator()(&local_4d8,&local_5b1);
  hash_internal::
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator()(&local_4b8,&local_5b1);
  local_560.id_ = 0;
  local_5a0 = (undefined1  [8])
              hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
              next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl;
  local_580._M_head_impl.id_ =
       (Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>)
       (Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
              next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl + 1);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ + 1;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashSetPolicy<std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::__cxx11::string>>
  ::parallel_hash_set<std::__cxx11::string_const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashSetPolicy<std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::__cxx11::string>>
              *)&local_498,&local_538,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_498,0x7b,
             (hasher *)local_5a0,(key_equal *)&local_580,&local_560);
  local_580._M_head_impl.id_ =
       (Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>)
       (Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>)
       local_498.sets_._M_elems[0].set_.settings_.
       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Tuple_impl<3UL,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<3UL,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
       ._M_head_impl.id_;
  testing::internal::
  CmpHelperEQ<phmap::priv::Alloc<std::__cxx11::string>,phmap::priv::Alloc<std::__cxx11::string>>
            ((internal *)local_5a0,"m.get_allocator()","alloc",&local_580._M_head_impl,&local_560);
  if (local_5a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_580);
    if (local_598.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_598.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0x16b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5b0,(Message *)&local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_5b0);
    if (local_580._M_head_impl.id_ != 0) {
      (**(code **)(*(long *)local_580._M_head_impl.id_ + 8))();
    }
  }
  if (local_598.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_598,
                 local_598.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
  }
  local_558 = 3;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::__cxx11::string_const*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_550,
             &local_538,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_498,
             (allocator_type *)local_5a0);
  local_578.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_540;
  local_578.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbStack_548;
  local_578.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_550;
  local_5a0._0_4_ = local_558;
  local_540 = (pointer)0x0;
  local_550 = (pointer)0x0;
  pbStack_548 = (pointer)0x0;
  local_580._M_head_impl.id_._0_4_ = local_558;
  local_598.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_598.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_598.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_598);
  keys<phmap::parallel_node_hash_set<std::__cxx11::string,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::__cxx11::string>,4ul,phmap::NullMutex>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_5a0,(priv *)&local_498,s);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::__cxx11::string>>
  ::operator()(&local_5b0,(char *)&local_580,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)"keys(m)");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_5a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_578);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_550);
  if ((char)local_5b0.data_ == '\0') {
    testing::Message::Message((Message *)local_5a0);
    if (local_5a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_5a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_580,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0x16c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_580,(Message *)local_5a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_580);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_5a0 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_5a0 + 8))();
    }
  }
  if (local_5a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_5a8,local_5a8);
  }
  lVar1 = 0x18;
  local_580._M_head_impl.id_ =
       (Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>)0;
  do {
    local_580._M_head_impl.id_ =
         (Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>)
         ((long)local_580._M_head_impl.id_ +
         *(long *)((long)&local_498.sets_._M_elems[0].set_.ctrl_ + lVar1));
    lVar1 = lVar1 + 0x48;
  } while (lVar1 != 0x498);
  local_5b0.data_._0_4_ = 0x7b;
  testing::internal::CmpHelperGE<unsigned_long,int>
            ((internal *)local_5a0,"m.bucket_count()","123",(unsigned_long *)&local_580,
             (int *)&local_5b0);
  if (local_5a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_580);
    if (local_598.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_598.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_5b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0x16d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5b0,(Message *)&local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_5b0);
    if (local_580._M_head_impl.id_ != 0) {
      (**(code **)(*(long *)local_580._M_head_impl.id_ + 8))();
    }
  }
  if (local_598.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_598,
                 local_598.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~parallel_hash_set(&local_498);
  lVar1 = -0xa0;
  paVar3 = &local_4b8.field_2;
  do {
    if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar3->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar3->_M_allocated_capacity)[-2],paVar3->_M_allocated_capacity + 1
                     );
    }
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar3->_M_allocated_capacity + -4);
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  return;
}

Assistant:

void InitializerListBucketAllocTest(std::true_type) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using A = typename TypeParam::allocator_type;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  A alloc(0);
  TypeParam m(values, 123, alloc);
  EXPECT_EQ(m.get_allocator(), alloc);
  EXPECT_THAT(keys(m), ::testing::UnorderedElementsAreArray(values));
  EXPECT_GE(m.bucket_count(), 123);
}